

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::Array2D<pbrt::SPPMPixel>::Array2D
          (Array2D<pbrt::SPPMPixel> *this,Bounds2i *extent,Allocator allocator)

{
  Frame *pFVar1;
  SampledSpectrum *pSVar2;
  undefined1 auVar4 [12];
  undefined1 auVar3 [64];
  SPPMPixel *pSVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  SPPMPixel *pSVar8;
  
  TVar6 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
       (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar6;
  (this->allocator).memoryResource = allocator.memoryResource;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  auVar15 = vpsubd_avx(auVar13,auVar15);
  auVar13 = vpshufd_avx(auVar15,0x55);
  auVar13 = vpmulld_avx(auVar13,auVar15);
  uVar12 = auVar13._0_4_;
  if (uVar12 == 0) {
    pSVar8 = (SPPMPixel *)0x0;
  }
  else {
    iVar7 = (*(allocator.memoryResource)->_vptr_memory_resource[2])
                      (allocator.memoryResource,(long)(int)uVar12 * 0xa0,8);
    pSVar8 = (SPPMPixel *)CONCAT44(extraout_var,iVar7);
  }
  this->values = pSVar8;
  if (0 < (int)uVar12) {
    lVar9 = 0x78;
    uVar10 = 0;
    auVar14 = ZEXT1664((undefined1  [16])0x0);
    do {
      pSVar5 = this->values;
      auVar3 = vmovdqu64_avx512f(auVar14);
      *(undefined1 (*) [64])
       &pSVar5[uVar10].vp.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = auVar3;
      pSVar8 = pSVar5 + uVar10;
      auVar3 = vmovdqu64_avx512f(auVar14);
      auVar4 = auVar3._4_12_;
      pSVar8->radius = (Float)auVar3._0_4_;
      (pSVar8->Ld).r = (Float)auVar4._0_4_;
      (pSVar8->Ld).g = (Float)auVar4._4_4_;
      (pSVar8->Ld).b = (Float)auVar4._8_4_;
      (pSVar8->vp).p = (Point3f)auVar3._16_12_;
      (pSVar8->vp).wo = (Vector3f)auVar3._28_12_;
      (pSVar8->vp).bsdf.bxdf = (BxDFHandle)auVar3._40_8_;
      (pSVar8->vp).bsdf.ng = (Normal3f)auVar3._48_12_;
      (pSVar8->vp).bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar3._60_4_;
      auVar3 = vmovdqu64_avx512f(auVar14);
      *(undefined1 (*) [64])&pSVar5[uVar10].vp.beta = auVar3;
      pFVar1 = &pSVar5[uVar10].vp.bsdf.shadingFrame;
      (pFVar1->x).super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
      (pFVar1->x).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
      *(undefined8 *)&(pFVar1->x).super_Tuple3<pbrt::Vector3,_float>.z = 0;
      (pFVar1->y).super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
      (pFVar1->y).super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
      (pFVar1->z).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
      (pFVar1->z).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
      pSVar5[uVar10].vp.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
      pSVar2 = &pSVar5[uVar10].vp.beta;
      (pSVar2->values).values[0] = 0.0;
      (pSVar2->values).values[1] = 0.0;
      (pSVar2->values).values[2] = 0.0;
      (pSVar2->values).values[3] = 0.0;
      lVar11 = 0;
      do {
        LOCK();
        *(undefined4 *)((long)(&(pSVar5->vp).beta + -6) + lVar11 + lVar9) = 0;
        UNLOCK();
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0x10);
      pSVar5[uVar10].m = (__atomic_base<int>)0x0;
      pSVar5[uVar10].tau.r = 0.0;
      pSVar5[uVar10].tau.g = 0.0;
      pSVar5[uVar10].tau.b = 0.0;
      pSVar5[uVar10].n = 0.0;
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0xa0;
    } while (uVar10 != uVar12);
  }
  return;
}

Assistant:

Array2D(const Bounds2i &extent, Allocator allocator = {})
        : extent(extent), allocator(allocator) {
        int n = extent.Area();
        values = allocator.allocate_object<T>(n);
        for (int i = 0; i < n; ++i)
            allocator.construct(values + i);
    }